

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

precise_unit units::checkSpecialUnits(string *unit_string,uint64_t match_flags)

{
  pointer pcVar1;
  undefined8 uVar2;
  unit_data uVar3;
  int iVar4;
  size_t __pos;
  ulong uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  bool bVar7;
  double dVar8;
  precise_unit pVar9;
  string ustring;
  precise_unit bunit;
  undefined1 local_120 [12];
  uint32_t uStack_114;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  precise_unit local_100;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  stack0xfffffffffffffee8 = local_120._0_8_;
  local_120._0_8_ = &local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"meter","");
  __pos = findWordOperatorSep(unit_string,(string *)local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._0_8_ != &local_110) {
    operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity + 1);
  }
  if (__pos != 0xffffffffffffffff) {
    local_120._0_8_ = &local_110;
    pcVar1 = (unit_string->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_120,pcVar1,pcVar1 + unit_string->_M_string_length);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,__pos,
               5);
    paVar6 = &local_f0.field_2;
    local_f0._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,local_120._0_8_,
               (pointer)(local_120._0_8_ + stack0xfffffffffffffee8));
    local_100 = unit_from_string_internal(&local_f0,match_flags);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar6) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    dVar8 = local_100.multiplier_;
    bVar7 = local_100.base_units_ != -0x56b5b78;
    if (bVar7 || !NAN(dVar8)) {
      uVar3 = detail::unit_data::operator*((unit_data *)(precise::m + 8),&local_100.base_units_);
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)CONCAT44(local_100.commodity_,uVar3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._0_8_ != &local_110) {
      operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity + 1);
    }
    if (bVar7 || !NAN(dVar8)) goto LAB_003b668e;
  }
  iVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0
                  ,3,"amp");
  if (iVar4 == 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,3,
               0xffffffffffffffff);
    pVar9 = unit_from_string_internal((string *)&local_d0,match_flags | 0x6000000000);
    dVar8 = pVar9.multiplier_;
    _local_120 = pVar9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (pVar9.base_units_ != (unit_data)0xfa94a488 || !NAN(dVar8)) {
      uVar3 = detail::unit_data::operator*
                        ((unit_data *)(precise::A + 8),(unit_data *)(local_120 + 8));
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)CONCAT44(uStack_114,uVar3);
      goto LAB_003b668e;
    }
  }
  if (*(unit_string->_M_dataplus)._M_p == '%') {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,1,
               0xffffffffffffffff);
    _local_120 = default_unit((string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((NAN(local_120._0_8_)) && (local_120._8_4_ == -0x56b5b78)) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,1,
                 0xffffffffffffffff);
      _local_120 = unit_from_string_internal((string *)&local_70,match_flags | 0x6000000000);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((NAN(local_120._0_8_)) && (local_120._8_4_ == -0x56b5b78)) goto LAB_003b655e;
    }
    local_100.base_units_ =
         detail::unit_data::operator*
                   ((unit_data *)(precise::percent + 8),(unit_data *)(precise::pu + 8));
    local_100.multiplier_ = 0.01;
    local_100.commodity_ = 0;
    uVar2 = local_120._0_8_;
    uVar3 = detail::unit_data::operator*(&local_100.base_units_,(unit_data *)(local_120 + 8));
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)CONCAT44(uStack_114 | local_100.commodity_,uVar3);
    dVar8 = (double)uVar2 * 0.01;
  }
  else {
LAB_003b655e:
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0xfa94a488;
    iVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string
                    ,0,2,"pu");
    dVar8 = NAN;
    if (iVar4 == 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,2,
                 0xffffffffffffffff);
      _local_120 = default_unit((string *)&local_90);
      uVar5 = local_120._8_8_;
      dVar8 = local_120._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((uVar5 & 0xffffffff) == 0xfa94a488 && NAN(dVar8)) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   2,0xffffffffffffffff);
        _local_120 = unit_from_string_internal((string *)&local_b0,match_flags | 0x6000000000);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        dVar8 = local_120._0_8_;
        if ((NAN(dVar8)) && (local_120._8_4_ == -0x56b5b78)) {
          dVar8 = NAN;
          goto LAB_003b668e;
        }
      }
      uVar3 = detail::unit_data::operator*
                        ((unit_data *)(precise::pu + 8),(unit_data *)(local_120 + 8));
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)CONCAT44(uStack_114,uVar3);
    }
  }
LAB_003b668e:
  pVar9._8_8_ = paVar6;
  pVar9.multiplier_ = dVar8;
  return pVar9;
}

Assistant:

static precise_unit
    checkSpecialUnits(const std::string& unit_string, std::uint64_t match_flags)
{
    // lets try checking for meter next which is one of the most common
    // reasons for getting here
    auto fnd = findWordOperatorSep(unit_string, "meter");
    if (fnd != std::string::npos) {
        std::string ustring = unit_string;
        ustring.erase(fnd, 5);
        auto bunit = unit_from_string_internal(ustring, match_flags);
        if (is_valid(bunit)) {
            return precise::m * bunit;
        }
    }
    // detect another somewhat common situation often amphour or ampsecond
    if (unit_string.compare(0, 3, "amp") == 0) {
        auto bunit = unit_from_string_internal(
            unit_string.substr(3), match_flags | minimum_partition_size3);
        if (is_valid(bunit)) {
            return precise::A * bunit;
        }
    }
    if (unit_string.front() == '%') {
        auto bunit = default_unit(unit_string.substr(1));
        if (is_valid(bunit)) {
            return precise::percent * precise::pu * bunit;
        }
        bunit = unit_from_string_internal(
            unit_string.substr(1), match_flags | minimum_partition_size3);
        if (is_valid(bunit)) {
            return precise::percent * precise::pu * bunit;
        }
    }
    if (unit_string.compare(0, 2, "pu") == 0) {
        auto bunit = default_unit(unit_string.substr(2));
        if (is_valid(bunit)) {
            return precise::pu * bunit;
        }
        bunit = unit_from_string_internal(
            unit_string.substr(2), match_flags | minimum_partition_size3);
        if (is_valid(bunit)) {
            return precise::pu * bunit;
        }
    }
    return precise::invalid;
}